

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O1

Box * __thiscall
amrex::BATransformer::operator()(Box *__return_storage_ptr__,BATransformer *this,Box *ab)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  switch(this->m_bat_type) {
  case null:
    uVar1 = *(undefined8 *)(ab->smallend).vect;
    uVar2 = *(undefined8 *)((ab->smallend).vect + 2);
    uVar3 = *(undefined8 *)((ab->bigend).vect + 2);
    *(undefined8 *)(__return_storage_ptr__->bigend).vect = *(undefined8 *)(ab->bigend).vect;
    *(undefined8 *)((__return_storage_ptr__->bigend).vect + 2) = uVar3;
    *(undefined8 *)(__return_storage_ptr__->smallend).vect = uVar1;
    *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) = uVar2;
    break;
  case indexType:
    BATindexType::operator()(__return_storage_ptr__,&(this->m_op).m_indexType,ab);
    break;
  case coarsenRatio:
    BATcoarsenRatio::operator()(__return_storage_ptr__,&(this->m_op).m_coarsenRatio,ab);
    break;
  case indexType_coarsenRatio:
    BATindexType_coarsenRatio::operator()
              (__return_storage_ptr__,&(this->m_op).m_indexType_coarsenRatio,ab);
    break;
  default:
    BATbndryReg::operator()(__return_storage_ptr__,&(this->m_op).m_bndryReg,ab);
  }
  return __return_storage_ptr__;
}

Assistant:

Box operator() (Box const& ab) const noexcept {
        switch (m_bat_type)
        {
        case     BATType::null:
            return m_op.m_null(ab);
        case     BATType::indexType:
            return m_op.m_indexType(ab);
        case     BATType::coarsenRatio:
            return m_op.m_coarsenRatio(ab);
        case     BATType::indexType_coarsenRatio:
            return m_op.m_indexType_coarsenRatio(ab);
        default:
            return m_op.m_bndryReg(ab);
        }
    }